

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O1

void ExtractFastKeypoints
               (Mat *anImage,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *fastPoints)

{
  pointer pKVar1;
  undefined8 uVar2;
  ostream *poVar3;
  int in_R8D;
  Ptr<cv::FastFeatureDetector> FAST;
  Mat anImage8;
  Mat srcImage;
  long *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  undefined4 local_108 [2];
  Mat *local_100;
  undefined8 local_f8;
  ushort local_f0 [48];
  undefined4 local_90 [2];
  Mat *local_88;
  undefined8 uStack_80;
  _InputArray local_30;
  
  pKVar1 = (fastPoints->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((fastPoints->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
      super__Vector_impl_data._M_finish != pKVar1) {
    (fastPoints->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
    super__Vector_impl_data._M_finish = pKVar1;
  }
  cv::FastFeatureDetector::create(&local_118,10,1);
  cv::Mat::Mat((Mat *)local_f0);
  if ((*(uint *)anImage & 0xfff) == 5) {
    uStack_80 = 0;
    local_90[0] = 0x2010000;
    local_88 = (Mat *)local_f0;
    cv::Mat::convertTo((_OutputArray *)anImage,(int)local_90,255.0,0.0);
  }
  else {
    cv::Mat::operator=((Mat *)local_f0,anImage);
  }
  cv::Mat::Mat((Mat *)local_90);
  if ((local_f0[0] & 0xff8) == 0) {
    local_f8 = 0;
    local_108[0] = 0x1010000;
    local_30.sz.width = 0;
    local_30.sz.height = 0;
    local_30.flags = 0x2010000;
    local_100 = (Mat *)local_f0;
    local_30.obj = (Mat *)local_90;
    cv::cvtColor((cv *)local_108,&local_30,(_OutputArray *)0x8,0,in_R8D);
  }
  else {
    cv::Mat::operator=((Mat *)local_90,(Mat *)local_f0);
  }
  local_f8 = 0;
  local_108[0] = 0x1010000;
  local_100 = (Mat *)local_90;
  uVar2 = cv::noArray();
  (**(code **)(*local_118 + 0x40))(local_118,local_108,fastPoints,uVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Detected ",9);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," FAST\n",6);
  cv::Mat::~Mat((Mat *)local_90);
  cv::Mat::~Mat((Mat *)local_f0);
  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
  }
  return;
}

Assistant:

static
void ExtractFastKeypoints(cv::Mat const &anImage, std::vector<cv::KeyPoint> &fastPoints)
{
  fastPoints.clear();
  auto FAST = cv::FastFeatureDetector::create();

  cv::Mat anImage8;
  if (anImage.type() == CV_32F)
    anImage.convertTo(anImage8, CV_8U, 255.0);
  else
    anImage8 = anImage;

  cv::Mat srcImage;
  if (anImage8.channels() == 1)
    cv::cvtColor(anImage8, srcImage, cv::COLOR_GRAY2BGR);
  else
    srcImage = anImage8;

  FAST->detect(srcImage, fastPoints);
  std::cerr << "Detected " << fastPoints.size() << " FAST\n";
}